

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

void __thiscall
pstack::Dwarf::DIE::Attribute::Value::Value
          (Value *this,DWARFReader *r,FormEntry *forment,Unit *unit)

{
  Form FVar1;
  byte bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  intmax_t iVar6;
  uintmax_t uVar7;
  void *pvVar8;
  Off OVar9;
  Exception *this_00;
  Exception *pEVar10;
  size_t local_218;
  Exception local_1e8;
  string local_48;
  Unit *local_28;
  Unit *unit_local;
  FormEntry *forment_local;
  DWARFReader *r_local;
  Value *this_local;
  
  FVar1 = forment->form;
  local_28 = unit;
  unit_local = (Unit *)forment;
  forment_local = (FormEntry *)r;
  r_local = (DWARFReader *)this;
  if (FVar1 == DW_FORM_addr) {
    uVar7 = DWARFReader::getuint(r,(ulong)unit->addrlen);
    *(uintmax_t *)this = uVar7;
    return;
  }
  if (FVar1 == DW_FORM_block2) {
    pvVar8 = operator_new(0x10);
    memset(pvVar8,0,0x10);
    *(void **)this = pvVar8;
    uVar4 = DWARFReader::getu16((DWARFReader *)forment_local);
    *(ulong *)(*(long *)this + 8) = (ulong)uVar4;
    OVar9 = DWARFReader::getOffset((DWARFReader *)forment_local);
    **(Off **)this = OVar9;
    DWARFReader::skip((DWARFReader *)forment_local,*(Off *)(*(long *)this + 8));
    return;
  }
  if (FVar1 == DW_FORM_block4) {
    pvVar8 = operator_new(0x10);
    memset(pvVar8,0,0x10);
    *(void **)this = pvVar8;
    uVar5 = DWARFReader::getu32((DWARFReader *)forment_local);
    *(ulong *)(*(long *)this + 8) = (ulong)uVar5;
    OVar9 = DWARFReader::getOffset((DWARFReader *)forment_local);
    **(Off **)this = OVar9;
    DWARFReader::skip((DWARFReader *)forment_local,*(Off *)(*(long *)this + 8));
    return;
  }
  if (FVar1 == DW_FORM_data2) {
    uVar4 = DWARFReader::getu16(r);
    *(ulong *)this = (ulong)uVar4;
    return;
  }
  if (FVar1 == DW_FORM_data4) {
    uVar5 = DWARFReader::getu32(r);
    *(ulong *)this = (ulong)uVar5;
    return;
  }
  if (FVar1 == DW_FORM_data8) {
    uVar7 = DWARFReader::getuint(r,8);
    *(uintmax_t *)this = uVar7;
    return;
  }
  if (FVar1 == DW_FORM_string) {
    OVar9 = DWARFReader::getOffset(r);
    *(Off *)this = OVar9;
    DWARFReader::getstring_abi_cxx11_(&local_48,(DWARFReader *)forment_local);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  if (FVar1 == DW_FORM_block) {
LAB_00210037:
    pvVar8 = operator_new(0x10);
    memset(pvVar8,0,0x10);
    *(void **)this = pvVar8;
    uVar7 = DWARFReader::getuleb128((DWARFReader *)forment_local);
    *(uintmax_t *)(*(long *)this + 8) = uVar7;
    OVar9 = DWARFReader::getOffset((DWARFReader *)forment_local);
    **(Off **)this = OVar9;
    DWARFReader::skip((DWARFReader *)forment_local,*(Off *)(*(long *)this + 8));
    return;
  }
  if (FVar1 == DW_FORM_block1) {
    pvVar8 = operator_new(0x10);
    memset(pvVar8,0,0x10);
    *(void **)this = pvVar8;
    bVar2 = DWARFReader::getu8((DWARFReader *)forment_local);
    *(ulong *)(*(long *)this + 8) = (ulong)bVar2;
    OVar9 = DWARFReader::getOffset((DWARFReader *)forment_local);
    **(Off **)this = OVar9;
    DWARFReader::skip((DWARFReader *)forment_local,*(Off *)(*(long *)this + 8));
    return;
  }
  if (FVar1 == DW_FORM_data1) {
    bVar2 = DWARFReader::getu8(r);
    *(ulong *)this = (ulong)bVar2;
    return;
  }
  if (FVar1 == DW_FORM_flag) {
    uVar3 = DWARFReader::getu8(r);
    *this = (Value)(uVar3 != '\0');
    return;
  }
  if (FVar1 == DW_FORM_sdata) {
    iVar6 = DWARFReader::getsleb128(r);
    *(intmax_t *)this = iVar6;
    return;
  }
  if (FVar1 == DW_FORM_strp) {
LAB_0020fc62:
    if (unit->version < 3) {
      local_218 = 4;
    }
    else {
      local_218 = unit->dwarfLen;
    }
    iVar6 = DWARFReader::getint(r,local_218);
    *(intmax_t *)this = iVar6;
    return;
  }
  if (FVar1 == DW_FORM_udata) {
    uVar7 = DWARFReader::getuleb128(r);
    *(uintmax_t *)this = uVar7;
    return;
  }
  if (FVar1 == DW_FORM_ref_addr) {
    uVar7 = DWARFReader::getuint(r,unit->dwarfLen);
    *(uintmax_t *)this = uVar7;
    return;
  }
  if (FVar1 == DW_FORM_ref1) goto LAB_0020fdd8;
  if (FVar1 == DW_FORM_ref2) goto LAB_0020fdf5;
  if (FVar1 == DW_FORM_ref4) goto LAB_0020fe33;
  if (FVar1 == DW_FORM_ref8) {
    uVar7 = DWARFReader::getuint(r,8);
    *(uintmax_t *)this = uVar7;
    return;
  }
  if (FVar1 != DW_FORM_ref_udata) {
    if (FVar1 == DW_FORM_sec_offset) {
      iVar6 = DWARFReader::getint(r,unit->dwarfLen);
      *(intmax_t *)this = iVar6;
      return;
    }
    if (FVar1 == DW_FORM_exprloc) goto LAB_00210037;
    if (FVar1 == DW_FORM_flag_present) {
      *this = (Value)0x1;
      return;
    }
    if (1 < FVar1 - DW_FORM_strx) {
      if (FVar1 == DW_FORM_line_strp) goto LAB_0020fc62;
      if (FVar1 == DW_FORM_ref_sig8) {
        uVar7 = DWARFReader::getuint(r,8);
        *(uintmax_t *)this = uVar7;
        return;
      }
      if (FVar1 == DW_FORM_implicit_const) {
        *(intmax_t *)this = forment->value;
        return;
      }
      if (1 < FVar1 - DW_FORM_loclistx) {
        if (FVar1 != DW_FORM_strx1) {
          if (FVar1 == DW_FORM_strx2) {
LAB_0020fdf5:
            uVar4 = DWARFReader::getu16(r);
            *(ulong *)this = (ulong)uVar4;
            return;
          }
          if (FVar1 == DW_FORM_strx3) {
LAB_0020fe13:
            uVar7 = DWARFReader::getuint(r,3);
            *(uintmax_t *)this = uVar7;
            return;
          }
          if (FVar1 != DW_FORM_strx4) {
            if (FVar1 == DW_FORM_addrx1) goto LAB_0020fdd8;
            if (FVar1 == DW_FORM_addrx2) goto LAB_0020fdf5;
            if (FVar1 == DW_FORM_addrx3) goto LAB_0020fe13;
            if (FVar1 != DW_FORM_addrx4) {
              if (FVar1 == DW_FORM_GNU_ref_alt) {
                uVar7 = DWARFReader::getuint(r,unit->dwarfLen);
                *(uintmax_t *)this = uVar7;
                return;
              }
              if (FVar1 == DW_FORM_GNU_strp_alt) {
                iVar6 = DWARFReader::getint(r,unit->dwarfLen);
                *(intmax_t *)this = iVar6;
                return;
              }
              this_00 = (Exception *)__cxa_allocate_exception();
              memset(&local_1e8,0,0x1a0);
              Exception::Exception(&local_1e8);
              pEVar10 = Exception::operator<<(&local_1e8,(char (*) [16])"unhandled form ");
              pEVar10 = Exception::operator<<(pEVar10,(Form *)unit_local);
              pEVar10 = Exception::operator<<(pEVar10,(char (*) [24])" creating value for DIE");
              Exception::Exception(this_00,pEVar10);
              __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
            }
          }
LAB_0020fe33:
          uVar5 = DWARFReader::getu32(r);
          *(ulong *)this = (ulong)uVar5;
          return;
        }
LAB_0020fdd8:
        bVar2 = DWARFReader::getu8(r);
        *(ulong *)this = (ulong)bVar2;
        return;
      }
    }
  }
  uVar7 = DWARFReader::getuleb128(r);
  *(uintmax_t *)this = uVar7;
  return;
}

Assistant:

DIE::Attribute::Value::Value(DWARFReader &r, const FormEntry &forment, Unit *unit)
{
    switch (forment.form) {

    case DW_FORM_GNU_strp_alt: {
        addr = r.getint(unit->dwarfLen);
        break;
    }

    case DW_FORM_strp:
    case DW_FORM_line_strp:
        addr = r.getint(unit->version <= 2 ? 4 : unit->dwarfLen);
        break;

    case DW_FORM_GNU_ref_alt:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_addr:
        addr = r.getuint(unit->addrlen);
        break;

    case DW_FORM_data1:
        udata = r.getu8();
        break;

    case DW_FORM_data2:
        udata = r.getu16();
        break;

    case DW_FORM_data4:
        udata = r.getu32();
        break;

    case DW_FORM_data8:
        udata = r.getuint(8);
        break;

    case DW_FORM_sdata:
        sdata = r.getsleb128();
        break;

    case DW_FORM_udata:
        udata = r.getuleb128();
        break;

    // offsets in various sections...
    case DW_FORM_strx:
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
    case DW_FORM_addrx:
    case DW_FORM_ref_udata:
        addr = r.getuleb128();
        break;

    case DW_FORM_strx1:
    case DW_FORM_addrx1:
    case DW_FORM_ref1:
        addr = r.getu8();
        break;

    case DW_FORM_strx2:
    case DW_FORM_addrx2:
    case DW_FORM_ref2:
        addr = r.getu16();
        break;

    case DW_FORM_addrx3:
    case DW_FORM_strx3:
        addr = r.getuint(3);
        break;

    case DW_FORM_strx4:
    case DW_FORM_addrx4:
    case DW_FORM_ref4:
        addr = r.getu32();
        break;

    case DW_FORM_ref_addr:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_ref8:
        addr = r.getuint(8);
        break;

    case DW_FORM_string:
        addr = r.getOffset();
        r.getstring();
        break;

    case DW_FORM_block1:
        block = new Block();
        block->length = r.getu8();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block2:
        block = new Block();
        block->length = r.getu16();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block4:
        block = new Block();
        block->length = r.getu32();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_exprloc:
    case DW_FORM_block:
        block = new Block();
        block->length = r.getuleb128();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_flag:
        flag = r.getu8() != 0;
        break;

    case DW_FORM_flag_present:
        flag = true;
        break;

    case DW_FORM_sec_offset:
        addr = r.getint(unit->dwarfLen);
        break;

    case DW_FORM_ref_sig8:
        signature = r.getuint(8);
        break;

    case DW_FORM_implicit_const:
        sdata = forment.value;
        break;

    default:
        throw (Exception() << "unhandled form " << forment.form  << " creating value for DIE");
    }
}